

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

int Abc_NtkIsTrueCex(Abc_Ntk_t *pNtk,Abc_Cex_t *pCex)

{
  int iVar1;
  Aig_Man_t *pAig;
  undefined4 local_24;
  int fStrashed;
  int status;
  Aig_Man_t *pMan;
  Abc_Cex_t *pCex_local;
  Abc_Ntk_t *pNtk_local;
  
  local_24 = 0;
  iVar1 = Abc_NtkIsStrash(pNtk);
  pCex_local = (Abc_Cex_t *)pNtk;
  if (iVar1 == 0) {
    pCex_local = (Abc_Cex_t *)Abc_NtkStrash(pNtk,0,0,0);
  }
  pAig = Abc_NtkToDar((Abc_Ntk_t *)pCex_local,0,1);
  if (pAig != (Aig_Man_t *)0x0) {
    local_24 = Saig_ManVerifyCex(pAig,pCex);
    Aig_ManStop(pAig);
  }
  if (iVar1 == 0) {
    Abc_NtkDelete((Abc_Ntk_t *)pCex_local);
  }
  return local_24;
}

Assistant:

int Abc_NtkIsTrueCex( Abc_Ntk_t * pNtk, Abc_Cex_t * pCex )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Aig_Man_t * pMan;
    int status = 0, fStrashed = 0;
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash(pNtk, 0, 0, 0);
        fStrashed = 1;
    }
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan )
    {
        status = Saig_ManVerifyCex( pMan, pCex );
        Aig_ManStop( pMan );
    }
    if ( fStrashed )
        Abc_NtkDelete( pNtk );
    return status;
}